

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx11.cc
# Opt level: O0

void do_variadic(void)

{
  bool bVar1;
  int local_74 [2];
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  int local_10 [2];
  
  variadic<int,int>(0xf,0xf);
  variadic<int>(0xc);
  local_10[1] = 5;
  local_10[0] = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"a",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"a",&local_69);
  bVar1 = pairwise_equal<int,double,double,std::__cxx11::string,std::__cxx11::string>
                    (local_10 + 1,local_10,2.0,2.0,&local_30,&local_68);
  if (!bVar1) {
    __assert_fail("pairwise_equal(5, 5, 2.0, 2.0, std::string(\"a\"), std::string(\"a\"))",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/cxx11.cc",
                  0xb0,"void do_variadic()");
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  local_74[1] = 5;
  local_74[0] = 5;
  bVar1 = pairwise_equal<int,double,double>(local_74 + 1,local_74,2.0,3.0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!pairwise_equal(5, 5, 2.0, 3.0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/cxx11.cc",
                  0xb1,"void do_variadic()");
  }
  return;
}

Assistant:

void
do_variadic()
{
    variadic(15, 15);
    variadic(12);
    assert(pairwise_equal(5, 5, 2.0, 2.0, std::string("a"), std::string("a")));
    assert(!pairwise_equal(5, 5, 2.0, 3.0));
}